

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

Vec_Wec_t * Sbd_ManWindowRoots(Gia_Man_t *p,int nTfoLevels,int nTfoFanMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Bit_t *p_02;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vArr2;
  Vec_Int_t *vArr;
  bool bVar6;
  bool local_a9;
  int fRoot;
  int fAlwaysRoot;
  int Fan;
  int Id;
  int k2;
  int k;
  int i;
  Vec_Bit_t *vPoDrivers;
  Vec_Int_t *vNodes1;
  Vec_Int_t *vNodes0;
  Vec_Int_t *vNodes;
  Vec_Wec_t *vTemp;
  Vec_Wec_t *vTfos;
  int nTfoFanMax_local;
  int nTfoLevels_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_WecStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_WecStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_02 = Vec_BitStart(iVar1);
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark0(p);
  k2 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (k2 < iVar1) {
      pGVar4 = Gia_ManCi(p,k2);
      fAlwaysRoot = Gia_ObjId(p,pGVar4);
      bVar6 = fAlwaysRoot != 0;
    }
    if (!bVar6) break;
    pVVar5 = Vec_WecEntry(p_01,fAlwaysRoot);
    Vec_IntGrow(pVVar5,1);
    Vec_IntPush(pVVar5,fAlwaysRoot);
    k2 = k2 + 1;
  }
  for (k2 = 0; iVar1 = Vec_IntSize(p->vCos), k2 < iVar1; k2 = k2 + 1) {
    pGVar4 = Gia_ManCo(p,k2);
    iVar1 = Gia_ObjFaninId0p(p,pGVar4);
    Vec_BitWriteEntry(p_02,iVar1,1);
  }
  for (fAlwaysRoot = 0; fAlwaysRoot < p->nObjs; fAlwaysRoot = fAlwaysRoot + 1) {
    pGVar4 = Gia_ManObj(p,fAlwaysRoot);
    iVar1 = Gia_ObjIsAnd(pGVar4);
    if (iVar1 != 0) {
      iVar1 = Vec_BitEntry(p_02,fAlwaysRoot);
      bVar6 = true;
      if (iVar1 == 0) {
        iVar1 = Gia_ObjRefNumId(p,fAlwaysRoot);
        bVar6 = nTfoFanMax <= iVar1;
      }
      pGVar4 = Gia_ManObj(p,fAlwaysRoot);
      iVar1 = Gia_ObjFaninId0(pGVar4,fAlwaysRoot);
      pVVar5 = Vec_WecEntry(p_01,iVar1);
      pGVar4 = Gia_ManObj(p,fAlwaysRoot);
      iVar1 = Gia_ObjFaninId1(pGVar4,fAlwaysRoot);
      vArr2 = Vec_WecEntry(p_01,iVar1);
      vArr = Vec_WecEntry(p_01,fAlwaysRoot);
      Vec_IntTwoMerge2(pVVar5,vArr2,vArr);
      Fan = 0;
      for (Id = 0; iVar1 = Vec_IntSize(vArr), Id < iVar1; Id = Id + 1) {
        iVar1 = Vec_IntEntry(vArr,Id);
        local_a9 = true;
        if (!bVar6) {
          iVar2 = Gia_ObjLevelId(p,fAlwaysRoot);
          iVar3 = Gia_ObjLevelId(p,iVar1);
          local_a9 = nTfoLevels <= iVar2 - iVar3;
        }
        iVar2 = Abc_Var2Lit(fAlwaysRoot,(uint)local_a9);
        Vec_WecPush(p_00,iVar1,iVar2);
        if (local_a9 == 0) {
          Vec_IntWriteEntry(vArr,Fan,iVar1);
          Fan = Fan + 1;
        }
      }
      Vec_IntShrink(vArr,Fan);
      if (!bVar6) {
        Vec_IntPush(vArr,fAlwaysRoot);
      }
    }
  }
  Vec_WecFree(p_01);
  Vec_BitFree(p_02);
  return p_00;
}

Assistant:

Vec_Wec_t * Sbd_ManWindowRoots( Gia_Man_t * p, int nTfoLevels, int nTfoFanMax )
{
    Vec_Wec_t * vTfos = Vec_WecStart( Gia_ManObjNum(p) ); // TFO nodes with roots marked
    Vec_Wec_t * vTemp = Vec_WecStart( Gia_ManObjNum(p) ); // storage
    Vec_Int_t * vNodes, * vNodes0, * vNodes1;
    Vec_Bit_t * vPoDrivers = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, k2, Id, Fan;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark0( p );
    Gia_ManForEachCiId( p, Id, i )
    {
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntGrow( vNodes, 1 );
        Vec_IntPush( vNodes, Id );
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_BitWriteEntry( vPoDrivers, Id, 1 );
    Gia_ManForEachAndId( p, Id )
    {
        int fAlwaysRoot = Vec_BitEntry(vPoDrivers, Id) || (Gia_ObjRefNumId(p, Id) >= nTfoFanMax);
        vNodes0 = Vec_WecEntry( vTemp, Gia_ObjFaninId0(Gia_ManObj(p, Id), Id) );
        vNodes1 = Vec_WecEntry( vTemp, Gia_ObjFaninId1(Gia_ManObj(p, Id), Id) );
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntTwoMerge2( vNodes0, vNodes1, vNodes );
        k2 = 0;
        Vec_IntForEachEntry( vNodes, Fan, k )
        {
            int fRoot = fAlwaysRoot || (Gia_ObjLevelId(p, Id) - Gia_ObjLevelId(p, Fan) >= nTfoLevels);
            Vec_WecPush( vTfos, Fan, Abc_Var2Lit(Id, fRoot) );
            if ( !fRoot ) Vec_IntWriteEntry( vNodes, k2++, Fan );
        }
        Vec_IntShrink( vNodes, k2 );
        if ( !fAlwaysRoot )
            Vec_IntPush( vNodes, Id );
    }
    Vec_WecFree( vTemp );
    Vec_BitFree( vPoDrivers );

    // print the results
    if ( 0 )
    Vec_WecForEachLevel( vTfos, vNodes, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, i)) )
            continue;
        printf( "Node %3d : ", i );
        Vec_IntForEachEntry( vNodes, Fan, k )
            printf( "%d%s ", Abc_Lit2Var(Fan), Abc_LitIsCompl(Fan)? "*":"" );
        printf( "\n" );
    }

    return vTfos;
}